

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_encoder.c
# Opt level: O1

lzma_ret stream_encoder_update
                   (void *coder_ptr,lzma_allocator *allocator,lzma_filter *filters,
                   lzma_filter *reversed_filters)

{
  long lVar1;
  lzma_ret lVar2;
  long *plVar3;
  
  if (*coder_ptr < 2) {
    *(undefined1 *)((long)coder_ptr + 4) = 0;
    *(lzma_filter **)((long)coder_ptr + 0x70) = filters;
    lVar2 = block_encoder_init((lzma_stream_coder_conflict *)coder_ptr,allocator);
    *(long *)((long)coder_ptr + 0x70) = (long)coder_ptr + 0x120;
    if (lVar2 == LZMA_OK) {
      *(undefined1 *)((long)coder_ptr + 4) = 1;
LAB_001a0b47:
      if (*(long *)((long)coder_ptr + 0x120) != -1) {
        plVar3 = (long *)((long)coder_ptr + 0x130);
        do {
          lzma_free((void *)plVar3[-1],allocator);
          lVar1 = *plVar3;
          plVar3 = plVar3 + 2;
        } while (lVar1 != -1);
      }
      lVar2 = lzma_filters_copy(filters,(lzma_filter *)((long)coder_ptr + 0x120),allocator);
      return lVar2;
    }
  }
  else {
    lVar2 = LZMA_PROG_ERROR;
    if (*coder_ptr < 4) {
      lVar2 = (**(code **)((long)coder_ptr + 0x48))
                        (*(undefined8 *)((long)coder_ptr + 8),allocator,filters);
      if (lVar2 == LZMA_OK) goto LAB_001a0b47;
    }
  }
  return lVar2;
}

Assistant:

static lzma_ret
stream_encoder_update(void *coder_ptr, const lzma_allocator *allocator,
		const lzma_filter *filters,
		const lzma_filter *reversed_filters)
{
	lzma_stream_coder *coder = coder_ptr;

	if (coder->sequence <= SEQ_BLOCK_INIT) {
		// There is no incomplete Block waiting to be finished,
		// thus we can change the whole filter chain. Start by
		// trying to initialize the Block encoder with the new
		// chain. This way we detect if the chain is valid.
		coder->block_encoder_is_initialized = false;
		coder->block_options.filters = (lzma_filter *)(filters);
		const lzma_ret ret = block_encoder_init(coder, allocator);
		coder->block_options.filters = coder->filters;
		if (ret != LZMA_OK)
			return ret;

		coder->block_encoder_is_initialized = true;

	} else if (coder->sequence <= SEQ_BLOCK_ENCODE) {
		// We are in the middle of a Block. Try to update only
		// the filter-specific options.
		return_if_error(coder->block_encoder.update(
				coder->block_encoder.coder, allocator,
				filters, reversed_filters));
	} else {
		// Trying to update the filter chain when we are already
		// encoding Index or Stream Footer.
		return LZMA_PROG_ERROR;
	}

	// Free the copy of the old chain and make a copy of the new chain.
	for (size_t i = 0; coder->filters[i].id != LZMA_VLI_UNKNOWN; ++i)
		lzma_free(coder->filters[i].options, allocator);

	return lzma_filters_copy(filters, coder->filters, allocator);
}